

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scpserver.c
# Opt level: O1

ScpServer * scp_recognise_exec(SshChannel *sc,SftpServerVtable *sftpserver_vt,ptrlen command)

{
  ptrlen whole;
  ptrlen whole_00;
  ptrlen whole_01;
  ptrlen whole_02;
  ptrlen whole_03;
  ptrlen whole_04;
  void *__src;
  size_t sVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  _Bool _Var4;
  uint uVar5;
  undefined8 *puVar6;
  SftpServer *pSVar7;
  strbuf *psVar8;
  ScpError *pSVar9;
  undefined8 *puVar10;
  undefined8 uVar11;
  char *fmt;
  undefined1 uVar12;
  byte bVar13;
  ScpServer *pSVar14;
  undefined1 uVar15;
  ptrlen prefix;
  ptrlen prefix_00;
  ptrlen prefix_01;
  ptrlen prefix_02;
  ptrlen prefix_03;
  ptrlen prefix_04;
  ptrlen prefix_05;
  ptrlen local_68;
  SshChannel *local_58;
  void *local_50;
  SftpServerVtable *local_48;
  char *local_40;
  void *local_38;
  
  prefix.len = 4;
  prefix.ptr = "scp ";
  local_68.ptr = command.ptr;
  local_68.len = command.len;
  _Var4 = ptrlen_startswith(command,prefix,&local_68);
  if (_Var4) {
    uVar11 = 0;
    uVar12 = 0;
    uVar15 = 0;
    local_58 = sc;
    local_48 = sftpserver_vt;
    local_40 = (char *)command.len;
    local_38 = command.ptr;
    do {
      local_50 = (void *)CONCAT44(local_50._4_4_,(int)uVar11);
      uVar2 = uVar12;
      uVar3 = uVar15;
      do {
        do {
          do {
            uVar15 = uVar3;
            uVar12 = uVar2;
            whole.len = local_68.len;
            whole.ptr = local_68.ptr;
            prefix_00.len = 3;
            prefix_00.ptr = "-v ";
            _Var4 = ptrlen_startswith(whole,prefix_00,&local_68);
            uVar2 = uVar12;
            uVar3 = uVar15;
          } while (_Var4);
          whole_00.len = local_68.len;
          whole_00.ptr = local_68.ptr;
          prefix_01.len = 3;
          prefix_01.ptr = "-r ";
          _Var4 = ptrlen_startswith(whole_00,prefix_01,&local_68);
          uVar3 = 1;
        } while (_Var4);
        whole_01.len = local_68.len;
        whole_01.ptr = local_68.ptr;
        prefix_02.len = 3;
        prefix_02.ptr = "-p ";
        _Var4 = ptrlen_startswith(whole_01,prefix_02,&local_68);
        uVar2 = 1;
        uVar3 = uVar15;
      } while (_Var4);
      whole_02.len = local_68.len;
      whole_02.ptr = local_68.ptr;
      prefix_03.len = 3;
      prefix_03.ptr = "-d ";
      uVar11 = 0;
      _Var4 = ptrlen_startswith(whole_02,prefix_03,&local_68);
      uVar11 = CONCAT71((int7)((ulong)uVar11 >> 8),1);
    } while (_Var4);
    whole_03.len = local_68.len;
    whole_03.ptr = local_68.ptr;
    prefix_04.len = 3;
    prefix_04.ptr = "-t ";
    _Var4 = ptrlen_startswith(whole_03,prefix_04,&local_68);
    sVar1 = local_68.len;
    __src = local_68.ptr;
    whole_04.len = local_68.len;
    whole_04.ptr = local_68.ptr;
    if (_Var4) {
      puVar6 = (undefined8 *)safemalloc(1,0x168,0);
      memset(puVar6,0,0x168);
      puVar6[0x2c] = &ScpSink_ScpServer_vt;
      puVar6[0x2a] = 0;
      puVar6[0x2b] = 0;
      puVar6[0x1c] = 0;
      puVar6[0x1d] = 0;
      puVar6[0x1e] = 0;
      puVar6[0x1f] = 0;
      puVar6[0x20] = 0;
      puVar6[0x21] = 0;
      puVar6[0x22] = 0;
      puVar6[0x23] = 0;
      puVar6[0x24] = 0;
      puVar6[0x25] = 0;
      puVar6[0x26] = 0;
      puVar6[0x27] = 0;
      puVar6[0x28] = 0;
      puVar6[0x29] = 0;
      puVar6[0x2b] = &ScpReplyReceiver_vt;
      puVar6[1] = local_58;
      pSVar7 = (*local_48->new)(local_48);
      *puVar6 = pSVar7;
      bufchain_init((bufchain *)(puVar6 + 8));
      psVar8 = strbuf_new();
      puVar6[0xe] = psVar8;
      psVar8 = strbuf_new();
      puVar6[0x10] = psVar8;
      bVar13 = (byte)local_50;
      if (((ulong)local_50 & 1) == 0) {
        (**(code **)(*(long *)*puVar6 + 0x50))((long *)*puVar6,puVar6 + 0x2b,__src,sVar1,1);
        if ((*(char *)(puVar6 + 0x1c) == '\0') && ((*(byte *)(puVar6 + 0x1e) & 4) != 0)) {
          bVar13 = (*(byte *)((long)puVar6 + 0x111) & 0x40) >> 6;
        }
        else {
          bVar13 = 0;
        }
      }
      pSVar14 = (ScpServer *)(puVar6 + 0x2c);
      puVar10 = (undefined8 *)safemalloc(1,0x20,sVar1);
      puVar10[1] = puVar10 + 4;
      puVar10[2] = sVar1;
      memcpy(puVar10 + 4,__src,sVar1);
      *(byte *)(puVar10 + 3) = bVar13 & 1;
      *puVar10 = puVar6[2];
      puVar6[2] = puVar10;
      queue_toplevel_callback(scp_sink_start_callback,puVar6);
    }
    else {
      prefix_05.len = 3;
      prefix_05.ptr = "-f ";
      fmt = (char *)local_68.len;
      _Var4 = ptrlen_startswith(whole_04,prefix_05,&local_68);
      sVar1 = local_68.len;
      if (_Var4) {
        local_50 = local_68.ptr;
        puVar6 = (undefined8 *)safemalloc(1,0xe0,0);
        memset(puVar6,0,0xe0);
        pSVar14 = (ScpServer *)(puVar6 + 0x1b);
        puVar6[0x1b] = &ScpSource_ScpServer_vt;
        puVar6[0x19] = 0;
        puVar6[0x1a] = 0;
        puVar6[0xb] = 0;
        puVar6[0xc] = 0;
        puVar6[0xd] = 0;
        puVar6[0xe] = 0;
        puVar6[0xf] = 0;
        puVar6[0x10] = 0;
        puVar6[0x11] = 0;
        puVar6[0x12] = 0;
        puVar6[0x13] = 0;
        puVar6[0x14] = 0;
        puVar6[0x15] = 0;
        puVar6[0x16] = 0;
        puVar6[0x17] = 0;
        puVar6[0x18] = 0;
        puVar6[0x1a] = &ScpReplyReceiver_vt;
        puVar6[2] = local_58;
        pSVar7 = (*local_48->new)(local_48);
        *puVar6 = pSVar7;
        *(undefined4 *)(puVar6 + 8) = 0;
        puVar10 = (undefined8 *)safemalloc(1,0x70,sVar1);
        local_58 = (SshChannel *)(puVar10 + 0xe);
        memcpy(local_58,local_50,sVar1);
        puVar10[2] = local_58;
        puVar10[3] = sVar1;
        puVar10[4] = (char *)(sVar1 + 0x70) + (long)puVar10;
        puVar10[5] = 0;
        puVar10[6] = 0;
        puVar10[7] = 0;
        puVar10[8] = 0;
        puVar10[9] = 0;
        puVar10[10] = 0;
        puVar10[0xb] = 0;
        puVar10[0xc] = 0;
        puVar10[0xd] = 0;
        *(undefined4 *)(puVar10 + 1) = 0;
        *puVar10 = puVar6[3];
        puVar6[3] = puVar10;
        *(undefined1 *)(puVar6 + 4) = uVar15;
        *(undefined1 *)((long)puVar6 + 0x21) = uVar12;
      }
      else {
        uVar5 = string_length_for_printf((size_t)local_40);
        pSVar9 = scp_error_new(local_58,fmt,(ulong)uVar5,local_38);
        pSVar14 = &pSVar9->scpserver;
      }
    }
  }
  else {
    pSVar14 = (ScpServer *)0x0;
  }
  return pSVar14;
}

Assistant:

ScpServer *scp_recognise_exec(
    SshChannel *sc, const SftpServerVtable *sftpserver_vt, ptrlen command)
{
    bool recursive = false, preserve = false;
    bool targetshouldbedirectory = false;
    ptrlen command_orig = command;

    if (!ptrlen_startswith(command, PTRLEN_LITERAL("scp "), &command))
        return NULL;

    while (1) {
        if (ptrlen_startswith(command, PTRLEN_LITERAL("-v "), &command)) {
            /* Enable verbose mode in the server, which we ignore */
            continue;
        }
        if (ptrlen_startswith(command, PTRLEN_LITERAL("-r "), &command)) {
            recursive = true;
            continue;
        }
        if (ptrlen_startswith(command, PTRLEN_LITERAL("-p "), &command)) {
            preserve = true;
            continue;
        }
        if (ptrlen_startswith(command, PTRLEN_LITERAL("-d "), &command)) {
            targetshouldbedirectory = true;
            continue;
        }
        break;
    }

    if (ptrlen_startswith(command, PTRLEN_LITERAL("-t "), &command)) {
        ScpSink *scp = scp_sink_new(sc, sftpserver_vt, command,
                                    targetshouldbedirectory);
        return &scp->scpserver;
    } else if (ptrlen_startswith(command, PTRLEN_LITERAL("-f "), &command)) {
        ScpSource *scp = scp_source_new(sc, sftpserver_vt, command);
        scp->recursive = recursive;
        scp->send_file_times = preserve;
        return &scp->scpserver;
    } else {
        ScpError *scp = scp_error_new(
            sc, "Unable to parse scp command: '%.*s'",
            PTRLEN_PRINTF(command_orig));
        return &scp->scpserver;
    }
}